

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O2

BigNumber * __thiscall
BigNumber::m_square_and_multiply
          (BigNumber *__return_storage_ptr__,BigNumber *this,BigNumber *e,BigNumber *N,int r,
          BigNumber *v,BigNumber *real_r2)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  BigNumber *nb;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  allocator_type local_161;
  BigNumber *local_160;
  BigNumber *local_158;
  ulong local_150;
  BigNumber m1;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_128;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  BigNumber unite;
  BigNumber local_d8;
  char local_b8 [40];
  BigNumber local_90;
  BigNumber local_70;
  BigNumber local_50;
  
  unite.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)&unite;
  local_160 = v;
  local_158 = e;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_110,__l,
             (allocator_type *)&m1);
  BigNumber(__return_storage_ptr__,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_110
            ,this->m_base);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_110);
  m1.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&m1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_128,__l_00,&local_161);
  BigNumber(&unite,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_128,this->m_base);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_128);
  montgomery(&m1,this,real_r2,N,r,local_160);
  bVar3 = true;
  uVar1 = (ulong)((long)(local_158->super_Polynome).m_coef.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(local_158->super_Polynome).m_coef.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2 & 0xffffffff;
  do {
    if (uVar1 == 0) {
      montgomery(&local_d8,__return_storage_ptr__,&unite,N,r,local_160);
      operator=(__return_storage_ptr__,&local_d8);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d8);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&m1);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&unite);
      return __return_storage_ptr__;
    }
    local_150 = uVar1 - 1;
    representation_binaire
              ((local_158->super_Polynome).m_coef.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar1 - 1],local_b8,32.0);
    for (lVar2 = 0; uVar1 = local_150, lVar2 != 0x20; lVar2 = lVar2 + 1) {
      if (bVar3) {
        bVar3 = true;
        if (local_b8[lVar2] == '1') {
          BigNumber(&local_70,&m1);
          nb = &local_70;
          operator=(__return_storage_ptr__,nb);
LAB_001023f2:
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)nb);
          goto LAB_001023fa;
        }
      }
      else {
        montgomery(&local_50,__return_storage_ptr__,__return_storage_ptr__,N,r,local_160);
        operator=(__return_storage_ptr__,&local_50);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
        if (local_b8[lVar2] == '1') {
          montgomery(&local_90,__return_storage_ptr__,&m1,N,r,local_160);
          nb = &local_90;
          operator=(__return_storage_ptr__,nb);
          goto LAB_001023f2;
        }
LAB_001023fa:
        bVar3 = false;
      }
    }
  } while( true );
}

Assistant:

BigNumber BigNumber::m_square_and_multiply(BigNumber &e, BigNumber &N, const int r, BigNumber &v, BigNumber &real_r2){

    unsigned int size = 32;
    char representation[(unsigned long)size];
    BigNumber result ({1}, m_base);
    BigNumber unite ({1}, m_base);
    BigNumber m1 = montgomery(*this, real_r2, N, r, v);
    bool empty = true;

    for(unsigned long i = e.m_degre() ; i > 0; i--){
        representation_binaire(e.m_coef[i - 1], representation, size);
        for(unsigned int j = 0; j < size; j++) {
            //cout << i << "  " << j << "   " << e.m_degre() << endl;
            if(!empty) {
                result = montgomery(result, result, N, r, v);
            }
            if (representation[j] == '1') {
                if(empty){
                    result = m1;
                    empty = false;
                }
                else {
                    result = montgomery(result, m1, N, r, v);
                }
            }
        }

    }
    result = montgomery(result, unite, N, r, v);
    return result;
}